

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_true>::delete_prefix_leaf(DaTrie<true,_true,_true> *this,Query *query)

{
  uint32_t uVar1;
  reference pvVar2;
  size_t sVar3;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  DaTrie<true,_true,_true> *unaff_retaddr;
  size_t edge_size;
  uint32_t parent_pos;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *pvVar4;
  uint32_t node_pos;
  
  pvVar4 = in_RDI;
  uVar1 = Query::node_pos(in_RSI);
  node_pos = (uint32_t)((ulong)pvVar4 >> 0x20);
  pvVar2 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar1);
  uVar1 = Bc::check(pvVar2);
  sVar3 = edge_size_((DaTrie<true,_true,_true> *)query,parent_pos,edge_size);
  Query::node_pos(in_RSI);
  delete_sib_(unaff_retaddr,node_pos);
  Query::node_pos(in_RSI);
  unfix_(unaff_retaddr,node_pos,(vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RSI);
  if (sVar3 == 1) {
    pvVar2 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar1);
    Bc::set_base(pvVar2,0x7fffffff);
  }
  return;
}

Assistant:

void delete_prefix_leaf(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_leaf());
    assert(Prefix);

    auto parent_pos = bc_[query.node_pos()].check();
    auto edge_size = edge_size_(parent_pos, 2);
    assert(edge_size != 0);

    if (WithNLM) {
      delete_sib_(query.node_pos());
    }

    unfix_(query.node_pos(), blocks_);
    if (edge_size == 1) {
      bc_[parent_pos].set_base(INVALID_VALUE);
    }
  }